

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ResolveExprListNames(NameContext *pNC,ExprList *pList)

{
  Expr *pExpr;
  uint uVar1;
  ExprList_item *pEVar2;
  int iVar3;
  Parse *pParse;
  uint uVar4;
  long lVar5;
  long in_FS_OFFSET;
  undefined1 local_68 [40];
  anon_union_8_18_67db040d_for_u local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pList != (ExprList *)0x0) {
    local_68._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pParse = pNC->pParse;
    local_68._8_8_ = resolveExprStep;
    local_68._16_8_ = resolveSelectStep;
    local_68._24_8_ = (_func_void_Walker_ptr_Select_ptr *)0x0;
    uVar4 = pNC->ncFlags & 0x8009010;
    uVar1 = pNC->ncFlags & 0xf7ff6fef;
    pNC->ncFlags = uVar1;
    pEVar2 = pList->a;
    local_68._0_8_ = pParse;
    local_40.pNC = pNC;
    for (lVar5 = 0; lVar5 < pList->nExpr; lVar5 = lVar5 + 1) {
      pExpr = pEVar2->pExpr;
      if (pExpr != (Expr *)0x0) {
        iVar3 = pParse->nHeight + pExpr->nHeight;
        pParse->nHeight = iVar3;
        iVar3 = sqlite3ExprCheckHeight(pParse,iVar3);
        if (iVar3 == 0) {
          sqlite3WalkExprNN((Walker *)local_68,pExpr);
          *(int *)(local_68._0_8_ + 0x13c) = *(int *)(local_68._0_8_ + 0x13c) - pExpr->nHeight;
          uVar1 = pNC->ncFlags;
          if ((uVar1 & 0x8009010) != 0) {
            pExpr->flags = pExpr->flags | uVar1 & 0x8010;
            uVar4 = uVar4 | uVar1 & 0x8009010;
            uVar1 = uVar1 & 0xf7ff6fef;
            pNC->ncFlags = uVar1;
          }
          pParse = (Parse *)local_68._0_8_;
          if (*(int *)(local_68._0_8_ + 0x34) < 1) goto LAB_001787d1;
        }
        iVar3 = 1;
        goto LAB_001787e7;
      }
LAB_001787d1:
      pEVar2 = pEVar2 + 1;
    }
    pNC->ncFlags = uVar1 | uVar4;
  }
  iVar3 = 0;
LAB_001787e7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3ResolveExprListNames(
  NameContext *pNC,       /* Namespace to resolve expressions in. */
  ExprList *pList         /* The expression list to be analyzed. */
){
  int i;
  int savedHasAgg = 0;
  Walker w;
  if( pList==0 ) return SQLITE_OK;
  w.pParse = pNC->pParse;
  w.xExprCallback = resolveExprStep;
  w.xSelectCallback = resolveSelectStep;
  w.xSelectCallback2 = 0;
  w.u.pNC = pNC;
  savedHasAgg = pNC->ncFlags & (NC_HasAgg|NC_MinMaxAgg|NC_HasWin|NC_OrderAgg);
  pNC->ncFlags &= ~(NC_HasAgg|NC_MinMaxAgg|NC_HasWin|NC_OrderAgg);
  for(i=0; i<pList->nExpr; i++){
    Expr *pExpr = pList->a[i].pExpr;
    if( pExpr==0 ) continue;
#if SQLITE_MAX_EXPR_DEPTH>0
    w.pParse->nHeight += pExpr->nHeight;
    if( sqlite3ExprCheckHeight(w.pParse, w.pParse->nHeight) ){
      return SQLITE_ERROR;
    }
#endif
    sqlite3WalkExprNN(&w, pExpr);
#if SQLITE_MAX_EXPR_DEPTH>0
    w.pParse->nHeight -= pExpr->nHeight;
#endif
    assert( EP_Agg==NC_HasAgg );
    assert( EP_Win==NC_HasWin );
    testcase( pNC->ncFlags & NC_HasAgg );
    testcase( pNC->ncFlags & NC_HasWin );
    if( pNC->ncFlags & (NC_HasAgg|NC_MinMaxAgg|NC_HasWin|NC_OrderAgg) ){
      ExprSetProperty(pExpr, pNC->ncFlags & (NC_HasAgg|NC_HasWin) );
      savedHasAgg |= pNC->ncFlags &
                          (NC_HasAgg|NC_MinMaxAgg|NC_HasWin|NC_OrderAgg);
      pNC->ncFlags &= ~(NC_HasAgg|NC_MinMaxAgg|NC_HasWin|NC_OrderAgg);
    }
    if( w.pParse->nErr>0 ) return SQLITE_ERROR;
  }
  pNC->ncFlags |= savedHasAgg;
  return SQLITE_OK;
}